

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseQualSource
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  int t;
  Pattern *p;
  InputError *pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Network *local_48;
  double local_40;
  double b;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48 = nw;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_40);
    InputError::InputError(pIVar3,2,&local_e8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  t = Utilities::findMatch(pbVar1 + 1,QualSource::SourceTypeWords);
  if (t < 0) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_c8,(string *)(pbVar1 + 1));
    InputError::InputError(pIVar3,3,&local_c8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar2 = Utilities::parseNumber<double>(pbVar1 + 2,&local_40);
  if (!bVar2) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_a8,(string *)(pbVar1 + 2));
    InputError::InputError(pIVar3,6,&local_a8);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  if (0x60 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokenList->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    __lhs = pbVar1 + 3;
    bVar2 = std::operator!=(__lhs,"*");
    if (bVar2) {
      p = Network::pattern(local_48,__lhs);
      if (p == (Pattern *)0x0) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_88,(string *)__lhs);
        InputError::InputError(pIVar3,5,&local_88);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      goto LAB_00134a7a;
    }
  }
  p = (Pattern *)0x0;
LAB_00134a7a:
  bVar2 = QualSource::addSource(node,t,local_40,p);
  if (bVar2) {
    return;
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_68,"Node Source",(allocator *)((long)&b + 7));
  InputError::InputError(pIVar3,1,&local_68);
  __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseQualSource(Node* node, Network* nw, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - source type keyword
    // 2 - baseline source strength
    // 3 - time pattern ID (optional)

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read source type

    int t = Utilities::findMatch(tokens[1], QualSource::SourceTypeWords);
    if (t < 0) throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    // ... read baseline source strength

    double b;
    if ( !Utilities::parseNumber(tokens[2], b) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... read optional pattern name

    Pattern* p = 0;
    if ( tokenList.size() > 3 && tokens[3] != "*")
    {
        p = nw->pattern(tokens[3]);
        if (p == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
    }

    // ... add a water quality source to the node

    if ( !QualSource::addSource(node, t, b, p) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Source");
    }
}